

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O0

bool __thiscall
ViconCGStreamClientSDK::VCGClient::SetApexDeviceFeedback(VCGClient *this,uint i_DeviceID,bool i_bOn)

{
  bool bVar1;
  reference psVar2;
  element_type *this_00;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  undefined1 local_88 [8];
  shared_ptr<VViconCGStreamClient> pClient;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
  *__range1;
  _Self local_50;
  _Self local_48;
  iterator It;
  _Self local_30;
  _Self local_28;
  undefined1 local_1d;
  uint local_1c;
  bool i_bOn_local;
  VCGClient *pVStack_18;
  uint i_DeviceID_local;
  VCGClient *this_local;
  
  local_1d = i_bOn;
  local_1c = i_DeviceID;
  pVStack_18 = this;
  if (i_bOn) {
    local_28._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (&this->m_HapticDeviceOnList,&local_1c);
    local_30._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (&this->m_HapticDeviceOnList);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      return false;
    }
    pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (&this->m_HapticDeviceOnList,&local_1c);
    It._M_node = (_Base_ptr)pVar3.first._M_node;
  }
  else {
    local_48._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (&this->m_HapticDeviceOnList,&local_1c);
    local_50._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (&this->m_HapticDeviceOnList);
    bVar1 = std::operator==(&local_48,&local_50);
    if (bVar1) {
      return false;
    }
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::erase_abi_cxx11_
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
               &this->m_HapticDeviceOnList,(const_iterator)local_48._M_node);
  }
  __end1 = std::
           vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
           ::begin(&this->m_pClients);
  pClient.super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
       ::end(&this->m_pClients);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<VViconCGStreamClient>_*,_std::vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>_>
                                     *)&pClient.
                                        super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<VViconCGStreamClient>_*,_std::vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<VViconCGStreamClient>::shared_ptr
              ((shared_ptr<VViconCGStreamClient> *)local_88,psVar2);
    this_00 = std::
              __shared_ptr_access<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_88);
    VViconCGStreamClient::SetApexDeviceFeedback(this_00,&this->m_HapticDeviceOnList);
    std::shared_ptr<VViconCGStreamClient>::~shared_ptr((shared_ptr<VViconCGStreamClient> *)local_88)
    ;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<VViconCGStreamClient>_*,_std::vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool VCGClient::SetApexDeviceFeedback( unsigned int i_DeviceID, bool i_bOn )
{
  if( i_bOn )
  {
    if( m_HapticDeviceOnList.find( i_DeviceID ) != m_HapticDeviceOnList.end() )
    {
      return false;
    }
    m_HapticDeviceOnList.insert( i_DeviceID );
  }
  else
  {
    std::set< unsigned int >::iterator It = m_HapticDeviceOnList.find( i_DeviceID );
    if( It== m_HapticDeviceOnList.end() )
    {
      return false;
    } 
    m_HapticDeviceOnList.erase( It );
    
  }

  for( auto pClient : m_pClients )
  {
    pClient->SetApexDeviceFeedback( m_HapticDeviceOnList );
  }

  return true;
}